

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O1

int mm_read_mtx_array_size(FILE *f,int *M,int *N)

{
  int iVar1;
  char *pcVar2;
  char line [1025];
  char local_438 [1040];
  
  *N = 0;
  *M = 0;
  do {
    pcVar2 = fgets(local_438,0x401,(FILE *)f);
    if (pcVar2 == (char *)0x0) {
      return 0xc;
    }
  } while (local_438[0] == '%');
  iVar1 = __isoc99_sscanf(local_438,"%d %d",M,N);
  do {
    if (iVar1 == 2) {
      return 0;
    }
    iVar1 = __isoc99_fscanf(f,"%d %d",M,N);
  } while (iVar1 != -1);
  return 0xc;
}

Assistant:

int mm_read_mtx_array_size(FILE *f, int *M, int *N) {
    char line[MM_MAX_LINE_LENGTH];
    int num_items_read;
    /* set return null parameter values, in case we exit with errors */
    *M = *N = 0;

    /* now continue scanning until you reach the end-of-comments */
    do {
        if (fgets(line, MM_MAX_LINE_LENGTH, f) == NULL)
            return MM_PREMATURE_EOF;
    } while (line[0] == '%');

    /* line[] is either blank or has M,N, nz */
    if (sscanf(line, "%d %d", M, N) == 2)
        return 0;

    else /* we have a blank line */
        do {
            num_items_read = fscanf(f, "%d %d", M, N);
            if (num_items_read == EOF) return MM_PREMATURE_EOF;
        } while (num_items_read != 2);

    return 0;
}